

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIIHandleConstructorArgument_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,ParamData *param,bool definition,
          bool singular,bool takesOwnership)

{
  string *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *__s;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  string argumentType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string argumentName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60 = __return_storage_ptr__;
  bVar4 = TypeInfo::isConstPointer(&param->type);
  pbVar6 = local_60;
  __k = &(param->type).type;
  if (!bVar4) {
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&specialPointerTypes_abi_cxx11_._M_t,__k);
    if ((_Rb_tree_header *)cVar7._M_node ==
        &specialPointerTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      bVar4 = TypeInfo::isValue(&param->type);
      if ((!bVar4) || (bVar4 = isHandleType(this,__k), !bVar4)) {
        if (param->optional == true) {
          __assert_fail("!param.optional",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x256e,
                        "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                       );
        }
        if ((param->arraySizes).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (param->arraySizes).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"VULKAN_HPP_NAMESPACE","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Vk","");
          TypeInfo::compose(&local_100,&param->type,&local_e0,&local_c0);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_100," ");
          local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar10) {
            local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_a0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (pbVar6,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_c0.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
          _Var12._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_00190831;
        }
        else {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"VULKAN_HPP_NAMESPACE","");
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Vk","");
          TypeInfo::compose(&local_e0,&param->type,&local_c0,&local_80);
          anon_unknown.dwarf_18c225::generateStandardArray(&local_100,&local_e0,&param->arraySizes);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_100," const & ");
          local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p == paVar10) {
            local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_a0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (pbVar6,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          _Var12._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_00190831;
        }
        operator_delete(_Var12._M_p,local_c0.field_2._M_allocated_capacity + 1);
LAB_00190831:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (pbVar6,(param->name)._M_dataplus._M_p,(param->name)._M_string_length);
        return pbVar6;
      }
      if (!takesOwnership) {
        paVar10 = &local_e0.field_2;
        local_e0._M_dataplus._M_p = (pointer)paVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Vk","");
        pcVar2 = (param->type).type._M_dataplus._M_p;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,pcVar2,pcVar2 + (param->type).type._M_string_length);
        sVar3 = local_e0._M_string_length;
        if ((local_e0._M_string_length <= local_100._M_string_length) &&
           ((local_e0._M_string_length == 0 ||
            (iVar5 = bcmp(local_100._M_dataplus._M_p,local_e0._M_dataplus._M_p,
                          local_e0._M_string_length), iVar5 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&local_100,0,sVar3);
        }
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_100,0,0,"VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::",0x31);
        local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar9 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar9) {
          local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_a0._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (pbVar6,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar10) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (param->optional == true) {
          std::operator+(&local_100,"VULKAN_HPP_NAMESPACE::Optional<const ",pbVar6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_100,">");
          generateRAIIHandleConstructorArgument_abi_cxx11_();
        }
        std::operator+(&local_e0," const & ",&param->name);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (pbVar6,local_e0._M_dataplus._M_p,local_e0._M_string_length);
        local_100.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
        _Var12._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p == paVar10) {
          return pbVar6;
        }
        goto LAB_00190b89;
      }
      if (param->optional == true) {
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x255f,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      pcVar2 = (param->type).type._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar2,pcVar2 + (param->type).type._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_100," ");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_100,(param->name)._M_dataplus._M_p,(param->name)._M_string_length);
    }
    else {
      if (param->optional == true) {
        __assert_fail("!param.optional",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2557,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      bVar4 = TypeInfo::isNonConstPointer(&param->type);
      if (!bVar4) {
        __assert_fail("param.type.isNonConstPointer()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x2558,
                      "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                     );
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      pcVar2 = (param->type).type._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,pcVar2,pcVar2 + (param->type).type._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_100," & ");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_100,(param->name)._M_dataplus._M_p,(param->name)._M_string_length);
    }
    local_a0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar10) {
      local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_a0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar6,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) {
      return pbVar6;
    }
    goto LAB_00190b89;
  }
  local_a0._M_string_length = (size_type)(param->type).type._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)(param->type).type._M_string_length;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,"Vk");
  if (!bVar4) {
    __assert_fail("param.type.type.starts_with( \"Vk\" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x253f,
                  "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                 );
  }
  local_a0._M_string_length = (size_type)(param->name)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)(param->name)._M_string_length;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,"p");
  if (!bVar4) {
    __assert_fail("param.name.starts_with( \"p\" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x2540,
                  "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                 );
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"p","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar2 = (param->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar2,pcVar2 + (param->name)._M_string_length);
  if ((local_e0._M_string_length <= local_100._M_string_length) &&
     ((local_e0._M_string_length == 0 ||
      (iVar5 = bcmp(local_100._M_dataplus._M_p,local_e0._M_dataplus._M_p,local_e0._M_string_length),
      iVar5 == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_100,0,local_e0._M_string_length);
  }
  paVar10 = &local_e0.field_2;
  anon_unknown.dwarf_18c225::startLowerCase(&local_a0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar10) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  anon_unknown.dwarf_18c225::generateNamespacedType(&local_100,__k);
  pbVar6 = local_60;
  sVar3 = (param->lenExpression)._M_string_length;
  if (param->optional == true) {
    if (sVar3 != 0) {
      __assert_fail("param.lenExpression.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2545,
                    "std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument(const ParamData &, bool, bool, bool) const"
                   );
    }
    std::operator+(&local_50,"VULKAN_HPP_NAMESPACE::Optional<const ",&local_100);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,"> ");
    local_80._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar9) {
      local_80.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_80._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_80,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    local_c0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar9) {
      local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_c0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    __s = " = nullptr";
    if (definition) {
      __s = "";
    }
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,__s);
    pbVar6 = local_60;
    local_e0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar9) {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_60,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar10) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00190b5a;
LAB_00190b52:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  else if (sVar3 == 0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_c0," const & ");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_c0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    local_e0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar9) {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar6,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar10) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_00190b52;
  }
  else if (singular) {
    paVar9 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_100._M_dataplus._M_p,
               local_100._M_dataplus._M_p + local_100._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_c0," const & ");
    stripPluralS(&local_80,this,&local_a0);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar9) {
      uVar11 = local_c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_80._M_string_length + local_c0._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        uVar11 = local_80.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_80._M_string_length + local_c0._M_string_length) goto LAB_00190408;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_80,0,0,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    }
    else {
LAB_00190408:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_c0,local_80._M_dataplus._M_p,local_80._M_string_length);
    }
    local_e0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar1 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar1) {
      local_e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar8->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar6,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar9) goto LAB_00190b52;
  }
  else {
    std::operator+(&local_80,"VULKAN_HPP_NAMESPACE::ArrayProxy<",&local_100);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_80,"> const & ");
    local_c0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar9) {
      local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_c0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_c0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    local_e0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar9) {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar6,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar10) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) goto LAB_00190b52;
  }
LAB_00190b5a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_100.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
  _Var12._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
    return pbVar6;
  }
LAB_00190b89:
  operator_delete(_Var12._M_p,local_100.field_2._M_allocated_capacity + 1);
  return pbVar6;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleConstructorArgument( ParamData const & param, bool definition, bool singular, bool takesOwnership ) const
{
  std::string argument;
  if ( param.type.isConstPointer() )
  {
    assert( param.type.type.starts_with( "Vk" ) );
    assert( param.name.starts_with( "p" ) );
    std::string argumentName = startLowerCase( stripPrefix( param.name, "p" ) );
    std::string argumentType = generateNamespacedType( param.type.type );
    if ( param.optional )
    {
      assert( param.lenExpression.empty() );
      argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argumentType + "> " + argumentName + ( definition ? "" : " = nullptr" );
    }
    else if ( param.lenExpression.empty() )
    {
      argument = argumentType + " const & " + argumentName;
    }
    else if ( singular )
    {
      argument = argumentType + " const & " + stripPluralS( argumentName );
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::ArrayProxy<" + argumentType + "> const & " + argumentName;
    }
  }
  else if ( specialPointerTypes.contains( param.type.type ) )
  {
    assert( !param.optional );
    assert( param.type.isNonConstPointer() );
    argument = param.type.type + " & " + param.name;
  }
  else if ( ( param.type.isValue() ) && isHandleType( param.type.type ) )
  {
    if ( takesOwnership )
    {
      assert( !param.optional );
      argument = param.type.type + " " + param.name;
    }
    else
    {
      argument = "VULKAN_HPP_NAMESPACE::VULKAN_HPP_RAII_NAMESPACE::" + stripPrefix( param.type.type, "Vk" );
      if ( param.optional )
      {
        argument = "VULKAN_HPP_NAMESPACE::Optional<const " + argument + ">";
      }
      argument += " const & " + param.name;
    }
  }
  else
  {
    assert( !param.optional );
    if ( param.arraySizes.empty() )
    {
      argument = param.type.compose( "VULKAN_HPP_NAMESPACE" ) + " ";
    }
    else
    {
      argument = generateStandardArray( param.type.compose( "VULKAN_HPP_NAMESPACE" ), param.arraySizes ) + " const & ";
    }
    argument += param.name;
  }
  return argument;
}